

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O1

QString * __thiscall
LdConfigDirWrapper::translateGuardFlagsContent
          (QString *__return_storage_ptr__,LdConfigDirWrapper *this,QString *delim)

{
  uint uVar1;
  _Base_ptr p_Var2;
  DWORD flags;
  char16_t *pcVar3;
  QByteArrayView QVar4;
  bool isOk;
  QStringList list;
  QString flagInfo;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> flagsSet;
  char local_99;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  undefined1 local_60 [8];
  _Rb_tree_node_base local_58;
  
  local_99 = '\0';
  uVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,0x18,0xffffffffffffffff,&local_99);
  if (local_99 == '\0') {
    QVar4.m_data = (storage_type *)0x1;
    QVar4.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = (Data *)local_60;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_58._0_8_;
    (__return_storage_ptr__->d).size = (qsizetype)local_58._M_parent;
  }
  else {
    getGuardFlagsSet((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_60,(LdConfigDirWrapper *)(ulong)uVar1,flags);
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    local_98.size = 0;
    if (local_58._M_left != &local_58) {
      p_Var2 = local_58._M_left;
      do {
        translateGuardFlag(&local_78,p_Var2[1]._M_color);
        if (local_78.d.size != 0) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_78);
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
          }
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while (p_Var2 != &local_58);
    }
    pcVar3 = (delim->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)__return_storage_ptr__,(QChar *)&local_98,(longlong)pcVar3)
    ;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::translateGuardFlagsContent(const QString& delim)
{
    bool isOk = false;
    DWORD GuardFlags = this->getNumValue(GUARD_FLAGS, &isOk);
    if (!isOk) {
        return "-";
    }
    std::set<DWORD> flagsSet = LdConfigDirWrapper::getGuardFlagsSet(GuardFlags);
    std::set<DWORD>::iterator itr;
    QStringList list;
    for (itr = flagsSet.begin() ; itr != flagsSet.end(); ++itr) {
        const DWORD nextFlag = *itr;
        const QString flagInfo = LdConfigDirWrapper::translateGuardFlag(nextFlag);
        if (flagInfo.length() == 0) continue;
        list.append(flagInfo);
    }
    return list.join(delim);
}